

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TypeSpecializeLdLen
          (GlobOpt *this,Instr **instrRef,Value **src1ValueRef,Value **dstValueRef,
          bool *forceInvariantHoistingRef)

{
  undefined2 baseValueType;
  ValueInfo *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  RegOpnd *pRVar7;
  ArrayRegOpnd *this_01;
  IntConstantBounds sym;
  Value *pVVar8;
  IntConstantBounds local_48;
  IntConstantBounds lengthConstantBounds;
  
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b3,"(instrRef)","instrRef");
    if (!bVar2) goto LAB_00436eae;
    *puVar5 = 0;
  }
  pIVar6 = *instrRef;
  if (pIVar6 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b5,"(instr)","instr");
    if (!bVar2) goto LAB_00436eae;
    *puVar5 = 0;
    pIVar6 = *instrRef;
  }
  if (pIVar6->m_opcode != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b6,"(instr->m_opcode == Js::OpCode::LdLen_A)",
                       "instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar2) goto LAB_00436eae;
    *puVar5 = 0;
  }
  if (src1ValueRef == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b7,"(src1ValueRef)","src1ValueRef");
    if (!bVar2) goto LAB_00436eae;
    *puVar5 = 0;
  }
  if (dstValueRef == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b9,"(dstValueRef)","dstValueRef");
    if (!bVar2) goto LAB_00436eae;
    *puVar5 = 0;
  }
  if (forceInvariantHoistingRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29bb,"(forceInvariantHoistingRef)","forceInvariantHoistingRef");
    if (!bVar2) goto LAB_00436eae;
    *puVar5 = 0;
  }
  baseValueType = (*instrRef)->m_src1->m_valueType;
  bVar2 = DoLdLenIntSpec(this,*instrRef,(ValueType)baseValueType);
  if (bVar2) {
    if (this->prePassLoop == (Loop *)0x0) {
      pRVar7 = IR::Opnd::AsRegOpnd((*instrRef)->m_src1);
      bVar3 = IR::RegOpnd::IsArrayRegOpnd(pRVar7);
      if (bVar3) {
        this_01 = IR::RegOpnd::AsArrayRegOpnd(pRVar7);
        sym = (IntConstantBounds)IR::ArrayRegOpnd::LengthSym(this_01);
        if (sym != (IntConstantBounds)0x0) {
          CaptureByteCodeSymUses(this,*instrRef);
          lengthConstantBounds = (IntConstantBounds)*instrRef;
          *(OpCode *)((long)lengthConstantBounds + 0x30) = Ld_I4;
          pRVar7 = IR::RegOpnd::New((StackSym *)sym,*(IRType *)((long)sym + 0x1c),this->func);
          IR::Instr::ReplaceSrc1((Instr *)lengthConstantBounds,&pRVar7->super_Opnd);
          IR::Instr::ClearBailOutInfo(*instrRef);
          lengthConstantBounds = sym;
          pVVar8 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)sym);
          if (pVVar8 == (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d3,"(lengthValue)","lengthValue");
            if (!bVar3) goto LAB_00436eae;
            *puVar5 = 0;
          }
          *src1ValueRef = pVVar8;
          this_00 = pVVar8->valueInfo;
          local_48.lowerBound = 0;
          local_48.upperBound = 0;
          bVar3 = ValueInfo::TryGetIntConstantBounds(this_00,&local_48,false);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x29d7,
                               "(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds))",
                               "lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds)");
            if (!bVar3) goto LAB_00436eae;
            *puVar5 = 0;
          }
          if (-1 < local_48.lowerBound) {
LAB_00436dba:
            if ((IntConstantBounds)this_00->symStore == lengthConstantBounds) {
              this_00->symStore = (Sym *)0x0;
            }
            TypeSpecializeIntDst
                      (this,*instrRef,LdLen_A,*src1ValueRef,*src1ValueRef,(Value *)0x0,
                       BailOutOnIrregularLength,local_48.lowerBound,local_48.upperBound,dstValueRef,
                       (AddSubConstantInfo *)0x0);
            *forceInvariantHoistingRef = true;
            return bVar2;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x29d8,"(lengthConstantBounds.LowerBound() >= 0)",
                             "lengthConstantBounds.LowerBound() >= 0");
          if (bVar3) {
            *puVar5 = 0;
            goto LAB_00436dba;
          }
          goto LAB_00436eae;
        }
      }
      if (((*instrRef)->field_0x38 & 0x10) == 0) {
        BVar4 = BailOutOnIrregularLength;
        GenerateBailAtOperation(this,instrRef,BailOutOnIrregularLength);
      }
      else {
        BVar4 = IR::Instr::GetBailOutKind(*instrRef);
        if (BVar4 != BailOutMarkTempObject) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x29f6,"(instr->GetBailOutKind() == IR::BailOutMarkTempObject)",
                             "instr->GetBailOutKind() == IR::BailOutMarkTempObject");
          if (!bVar3) {
LAB_00436eae:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        BVar4 = BailOutMarkTempObject|BailOutOnIrregularLength;
        IR::Instr::SetBailOutKind(*instrRef,BailOutMarkTempObject|BailOutOnIrregularLength);
      }
    }
    else {
      BVar4 = BailOutOnIrregularLength;
    }
    TypeSpecializeIntDst
              (this,*instrRef,LdLen_A,(Value *)0x0,(Value *)0x0,(Value *)0x0,BVar4,0,0x7fffffff,
               dstValueRef,(AddSubConstantInfo *)0x0);
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::TypeSpecializeLdLen(
    IR::Instr * *const instrRef,
    Value * *const src1ValueRef,
    Value * *const dstValueRef,
    bool *const forceInvariantHoistingRef)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdLen_A);
    Assert(src1ValueRef);
    Value *&src1Value = *src1ValueRef;
    Assert(dstValueRef);
    Value *&dstValue = *dstValueRef;
    Assert(forceInvariantHoistingRef);
    bool &forceInvariantHoisting = *forceInvariantHoistingRef;

    if(!DoLdLenIntSpec(instr, instr->GetSrc1()->GetValueType()))
    {
        return false;
    }

    IR::BailOutKind bailOutKind = IR::BailOutOnIrregularLength;
    if(!IsLoopPrePass())
    {
        IR::RegOpnd *const baseOpnd = instr->GetSrc1()->AsRegOpnd();
        if(baseOpnd->IsArrayRegOpnd())
        {
            StackSym *const lengthSym = baseOpnd->AsArrayRegOpnd()->LengthSym();
            if(lengthSym)
            {
                CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Ld_I4;
                instr->ReplaceSrc1(IR::RegOpnd::New(lengthSym, lengthSym->GetType(), func));
                instr->ClearBailOutInfo();

                // Find the hoisted length value
                Value *const lengthValue = CurrentBlockData()->FindValue(lengthSym);
                Assert(lengthValue);
                src1Value = lengthValue;
                ValueInfo *const lengthValueInfo = lengthValue->GetValueInfo();
                IntConstantBounds lengthConstantBounds;
                AssertVerify(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds));
                Assert(lengthConstantBounds.LowerBound() >= 0);

                if (lengthValueInfo->GetSymStore() == lengthSym)
                {
                    // When type specializing the dst below, we will end up inserting lengthSym.u32 as symstore for a var
                    // Clear the symstore here, so that we dont end up with problems with copyprop later on
                    lengthValueInfo->SetSymStore(nullptr);
                }

                // Int-specialize, and transfer the value to the dst
                TypeSpecializeIntDst(
                    instr,
                    Js::OpCode::LdLen_A,
                    src1Value,
                    src1Value,
                    nullptr,
                    bailOutKind,
                    lengthConstantBounds.LowerBound(),
                    lengthConstantBounds.UpperBound(),
                    &dstValue);

                // Try to force hoisting the Ld_I4 so that the length will have an invariant sym store that can be
                // copy-propped. Invariant hoisting does not automatically hoist Ld_I4.
                forceInvariantHoisting = true;
                return true;
            }
        }

        if (instr->HasBailOutInfo())
        {
            Assert(instr->GetBailOutKind() == IR::BailOutMarkTempObject);
            bailOutKind = IR::BailOutOnIrregularLength | IR::BailOutMarkTempObject;
            instr->SetBailOutKind(bailOutKind);
        }
        else
        {
            Assert(bailOutKind == IR::BailOutOnIrregularLength);
            GenerateBailAtOperation(&instr, bailOutKind);
        }
    }

    TypeSpecializeIntDst(
        instr,
        Js::OpCode::LdLen_A,
        nullptr,
        nullptr,
        nullptr,
        bailOutKind,
        0,
        INT32_MAX,
        &dstValue);
    return true;
}